

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateBuffer
          (RenderDeviceGLImpl *this,BufferDesc *BuffDesc,BufferData *pBuffData,IBuffer **ppBuffer,
          bool bIsDeviceInternal)

{
  BufferData *BuffDesc_00;
  bool bVar1;
  Char *Message;
  DeviceContextGLImpl *this_00;
  GLContextState *__t;
  reference_wrapper<Diligent::GLContextState> local_70 [3];
  undefined1 local_58 [8];
  string msg;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  bool bIsDeviceInternal_local;
  IBuffer **ppBuffer_local;
  BufferData *pBuffData_local;
  BufferDesc *BuffDesc_local;
  RenderDeviceGLImpl *this_local;
  
  pDeviceContext.m_pObject._7_1_ = bIsDeviceInternal;
  ppBuffer_local = (IBuffer **)pBuffData;
  pBuffData_local = (BufferData *)BuffDesc;
  BuffDesc_local = (BufferDesc *)this;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg.field_2 + 8),(size_t)this
            );
  bVar1 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator!
                    ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  if (bVar1) {
    FormatString<char[44]>
              ((string *)local_58,(char (*) [44])"Immediate device context has been destroyed");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CreateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x16a);
    std::__cxx11::string::~string((string *)local_58);
  }
  BuffDesc_00 = pBuffData_local;
  this_00 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator->
                      ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  __t = DeviceContextGLImpl::GetContextState(this_00);
  local_70[0] = std::ref<Diligent::GLContextState>(__t);
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,Diligent::BufferData_const*,bool>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppBuffer,
             (BufferDesc *)BuffDesc_00,local_70,(BufferData **)&ppBuffer_local,
             (bool *)((long)&pDeviceContext.m_pObject + 7));
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateBuffer(const BufferDesc& BuffDesc, const BufferData* pBuffData, IBuffer** ppBuffer, bool bIsDeviceInternal)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    CreateBufferImpl(ppBuffer, BuffDesc, std::ref(pDeviceContext->GetContextState()), pBuffData, bIsDeviceInternal);
}